

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel_half_reif(IntVar *x,IntRelType t,IntVar *y,BoolView *r,int c)

{
  FILE *__stream;
  char *pcVar1;
  IntVar *in_RDX;
  undefined4 in_ESI;
  IntVar *in_RDI;
  int in_R8D;
  BoolView *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  IntView<0> in_stack_00000048;
  BoolView *in_stack_000002b0;
  IntView<0> in_stack_000002b8;
  IntView<0> in_stack_000002c8;
  char *local_120;
  IntView<0> local_108;
  IntView<0> local_f8;
  IntView<0> local_e8;
  IntView<0> local_d8;
  IntView<0> local_c8;
  IntView<0> local_b8;
  IntView<0> local_a8;
  IntView<0> local_98;
  IntView<0> local_88;
  IntView<0> local_78;
  IntView<0> local_68;
  IntView<0> local_58;
  IntView<0> local_48;
  IntView<0> local_38;
  int local_24;
  IntVar *local_18;
  IntVar *local_8;
  
  __stream = _stderr;
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_8 = in_RDI;
  switch(in_ESI) {
  case 0:
    IntView<0>::IntView(&local_38,in_RDI,1,0);
    IntView<0>::IntView(&local_48,local_18,1,local_24);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    IntView<0>::IntView(&local_58,local_18,1,0);
    IntView<0>::IntView(&local_68,local_8,1,-local_24);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    break;
  case 1:
    IntView<0>::IntView(&local_78,in_RDI,1,0);
    IntView<0>::IntView(&local_88,local_18,1,local_24);
    newBinNE(in_stack_00000048,(IntView<0>)in_stack_00000038,in_stack_00000030);
    break;
  case 2:
    IntView<0>::IntView(&local_98,in_RDX,1,0);
    IntView<0>::IntView(&local_a8,local_8,1,-local_24);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    break;
  case 3:
    IntView<0>::IntView(&local_b8,in_RDX,1,0);
    IntView<0>::IntView(&local_c8,local_8,1,1 - local_24);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    break;
  case 4:
    IntView<0>::IntView(&local_d8,in_RDI,1,0);
    IntView<0>::IntView(&local_e8,local_18,1,local_24);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    break;
  case 5:
    IntView<0>::IntView(&local_f8,in_RDI,1,0);
    IntView<0>::IntView(&local_108,local_18,1,local_24 + 1);
    newBinGE(in_stack_000002c8,in_stack_000002b8,in_stack_000002b0);
    break;
  default:
    pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      local_120 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                          ,0x2f);
      local_120 = local_120 + 1;
    }
    fprintf(__stream,"%s:%d: ",local_120,0x1b0);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  return;
}

Assistant:

void int_rel_half_reif(IntVar* x, IntRelType t, IntVar* y, const BoolView& r, int c) {
	switch (t) {
		case IRT_EQ:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			break;
		case IRT_NE:
			newBinNE(IntView<>(x), IntView<>(y, 1, c), r);
			break;
		case IRT_LE:
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			break;
		case IRT_LT:
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c), r);
			break;
		case IRT_GE:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			break;
		case IRT_GT:
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c), r);
			break;
		default:
			NEVER;
	}
}